

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O0

float range(float v,float lo,float hi,int *i)

{
  float fVar1;
  float fVar2;
  double dVar3;
  float v2;
  float r;
  int *i_local;
  float hi_local;
  float lo_local;
  float v_local;
  
  fVar2 = hi - lo;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    dVar3 = std::floor((double)(ulong)(uint)((v - lo) / fVar2));
    lo_local = -fVar2 * SUB84(dVar3,0) + lo + v;
    if (i != (int *)0x0) {
      fVar1 = 0.5;
      if (lo_local <= v) {
        fVar1 = -0.5;
      }
      *i = -(int)((lo_local - v) / fVar2 + fVar1);
    }
  }
  else {
    lo_local = lo;
    if (i != (int *)0x0) {
      *i = 0;
    }
  }
  return lo_local;
}

Assistant:

static float range(float v, float lo, float hi, int* i = 0)
{
	float r = hi - lo;
	if (r == 0) {
		if (i)
			*i = 0;
		return lo;
	}
	float v2 = lo + v - r*std::floor((v - lo)/r);
	if (i)
		*i = -(int)((v2 - v)/r + (v2 > v ? 0.5 : -0.5));
	return v2;
}